

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall
CVmObjGramProd::getp_get_gram_info
          (CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  CVmObjPageEntry *pCVar2;
  vm_datatype_t *pvVar3;
  vm_prop_id_t vVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  vm_obj_id_t vVar8;
  vm_obj_id_t vVar9;
  char *pcVar10;
  long lVar11;
  long *plVar12;
  ulong idx;
  undefined4 in_register_00000034;
  CVmObjPageEntry *this_00;
  vm_prop_id_t *pvVar13;
  ulong idx_00;
  ulong idx_01;
  vm_val_t alt_obj_val;
  
  if ((getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar6 != 0)) {
    getp_get_gram_info::desc.min_argc_ = 0;
    getp_get_gram_info::desc.opt_argc_ = 0;
    getp_get_gram_info::desc.varargs_ = 0;
    __cxa_guard_release(&getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_gram_info::desc);
  if (iVar6 == 0) {
    if (G_interpreter_X.super_CVmStack.max_depth_ <
        ((long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ >> 4) + 8U) {
      err_throw(0x8ff);
    }
    vVar7 = CVmObjList::create(0,*(size_t *)((this->super_CVmObject).ext_ + 0x38));
    this_00 = G_obj_table_X.pages_[vVar7 >> 0xc] + (vVar7 & 0xfff);
    CVmObjList::cons_clear((CVmObjList *)this_00);
    pvVar5 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = vVar7;
    pcVar10 = (this->super_CVmObject).ext_;
    plVar12 = *(long **)(pcVar10 + 0x30);
    for (idx_00 = 0; idx_00 < *(ulong *)(pcVar10 + 0x38); idx_00 = idx_00 + 1) {
      if (G_predef_X.gramprod_gram_alt_info == 0) {
        alt_obj_val.typ = VM_NIL;
        CVmObjList::cons_set_element((CVmObjList *)this_00,idx_00,&alt_obj_val);
      }
      else {
        vVar8 = CVmObjList::create(0,*(size_t *)(*plVar12 + 0x18));
        pCVar1 = G_obj_table_X.pages_[vVar8 >> 0xc];
        CVmObjList::cons_clear((CVmObjList *)(pCVar1 + (vVar8 & 0xfff)));
        pvVar5 = sp_;
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_OBJ;
        (pvVar5->val).obj = vVar8;
        lVar11 = *plVar12;
        pvVar13 = *(vm_prop_id_t **)(lVar11 + 0x10);
        for (idx_01 = 0; pvVar5 = sp_, idx_01 < *(ulong *)(lVar11 + 0x18); idx_01 = idx_01 + 1) {
          if (G_predef_X.gramprod_gram_alt_tok_info == 0) {
            alt_obj_val.typ = VM_NIL;
            goto LAB_00285e28;
          }
          switch((char)pvVar13[1]) {
          case '\x01':
            vVar9 = *(vm_obj_id_t *)(pvVar13 + 4);
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_OBJ;
            goto LAB_00285d87;
          case '\x02':
            vVar4 = pvVar13[4];
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_PROP;
            (pvVar5->val).prop = vVar4;
            break;
          case '\x03':
            sp_ = sp_ + 1;
            vVar9 = CVmObjString::create(0,*(char **)(pvVar13 + 4),*(size_t *)(pvVar13 + 8));
            pvVar5->typ = VM_OBJ;
            (pvVar5->val).obj = vVar9;
            break;
          case '\x04':
            vVar9 = *(vm_obj_id_t *)(pvVar13 + 4);
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_ENUM;
LAB_00285d87:
            (pvVar5->val).obj = vVar9;
            break;
          case '\x05':
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_NIL;
            break;
          case '\x06':
            vVar9 = CVmObjList::create(0,*(size_t *)(pvVar13 + 4));
            pvVar5 = sp_;
            pCVar2 = G_obj_table_X.pages_[vVar9 >> 0xc];
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_OBJ;
            (pvVar5->val).obj = vVar9;
            lVar11 = *(long *)(pvVar13 + 8);
            for (idx = 0; idx < *(ulong *)(pvVar13 + 4); idx = idx + 1) {
              alt_obj_val.typ = VM_PROP;
              alt_obj_val.val.prop = *(undefined2 *)(lVar11 + idx * 2);
              CVmObjList::cons_set_element
                        ((CVmObjList *)(pCVar2 + (vVar9 & 0xfff)),idx,&alt_obj_val);
            }
          }
          pvVar5 = sp_;
          vVar4 = pvVar13[1];
          pvVar3 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar3 = VM_INT;
          *(uint *)&pvVar5->val = (uint)(byte)vVar4;
          pvVar5 = sp_;
          if (*pvVar13 == 0) {
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_NIL;
          }
          else {
            vVar4 = *pvVar13;
            pvVar3 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar3 = VM_PROP;
            (pvVar5->val).prop = vVar4;
          }
          vVar9 = G_predef_X.gramprod_gram_alt_tok_info;
          pvVar5 = sp_;
          pvVar3 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar3 = VM_OBJ;
          (pvVar5->val).obj = vVar9;
          alt_obj_val.val.obj = CVmObjTads::create_from_stack((uchar **)0x0,4);
          alt_obj_val.typ = VM_OBJ;
LAB_00285e28:
          CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar8 & 0xfff)),idx_01,&alt_obj_val)
          ;
          pvVar13 = pvVar13 + 0x10;
          lVar11 = *plVar12;
        }
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_OBJ;
        (pvVar5->val).obj = vVar8;
        pvVar5 = sp_;
        vVar8 = *(vm_obj_id_t *)(*plVar12 + 0xc);
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_OBJ;
        (pvVar5->val).obj = vVar8;
        pvVar5 = sp_;
        vVar8 = *(vm_obj_id_t *)(*plVar12 + 4);
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_INT;
        (pvVar5->val).obj = vVar8;
        pvVar5 = sp_;
        vVar8 = *(vm_obj_id_t *)*plVar12;
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_INT;
        (pvVar5->val).obj = vVar8;
        vVar8 = G_predef_X.gramprod_gram_alt_info;
        pvVar5 = sp_;
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_OBJ;
        (pvVar5->val).obj = vVar8;
        alt_obj_val.val.obj = CVmObjTads::create_from_stack((uchar **)0x0,5);
        alt_obj_val.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)this_00,idx_00,&alt_obj_val);
        sp_ = sp_ + -1;
      }
      plVar12 = plVar12 + 1;
      pcVar10 = (this->super_CVmObject).ext_;
    }
    sp_ = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_get_gram_info(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    vm_obj_id_t alt_lst_id;
    CVmObjList *alt_lst;
    size_t i;
    vmgram_alt_info **altp;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /*
     *   This routine uses considerable extra stack in the course of its
     *   work, so check in advance that we have enough space to run.  
     */
    if (!G_stk->check_space(8))
        err_throw(VMERR_STACK_OVERFLOW);

    /* create a list to hold the rule alternatives */
    alt_lst_id = CVmObjList::create(vmg_ FALSE, get_ext()->alt_cnt_);
    alt_lst = (CVmObjList *)vm_objp(vmg_ alt_lst_id);
    alt_lst->cons_clear();

    /* push it onto the stack for protection from garbage collection */
    G_stk->push()->set_obj(alt_lst_id);

    /* create the rule-alternative descriptions */
    for (i = 0, altp = get_ext()->alts_ ; i < get_ext()->alt_cnt_ ;
         ++i, ++altp)
    {
        size_t j;
        vmgram_tok_info *tokp;
        vm_val_t alt_obj_val;
        vm_obj_id_t tok_lst_id;
        CVmObjList *tok_lst;

        /* 
         *   if our imported GrammarAltInfo class isn't defined, we can't
         *   provide rule-alternative information, so just fill in the list
         *   with a nil 
         */
        if (G_predef->gramprod_gram_alt_info == VM_INVALID_OBJ)
        {
            /* add a nil to the list */
            alt_obj_val.set_nil();
            alt_lst->cons_set_element(i, &alt_obj_val);

            /* done with this slot */
            continue;
        }

        /* create a list to hold the token descriptors */
        tok_lst_id = CVmObjList::create(vmg_ FALSE, (*altp)->tok_cnt);
        tok_lst = (CVmObjList *)vm_objp(vmg_ tok_lst_id);
        tok_lst->cons_clear();

        /* push this momentarily for gc protection */
        G_stk->push()->set_obj(tok_lst_id);

        /*
         *   Run through the tokens in the rule alternative, and build a list
         *   of token descriptor structures. 
         */
        for (j = 0, tokp = (*altp)->toks ; j < (*altp)->tok_cnt ; ++j, ++tokp)
        {
            vm_val_t tok_obj_val;

            /* 
             *   if our imported GrammarAltTokInfo class isn't defined, we
             *   can't provide token information, so just fill in the list
             *   with a nil 
             */
            if (G_predef->gramprod_gram_alt_tok_info == VM_INVALID_OBJ)
            {
                /* add a nil to the list */
                tok_obj_val.set_nil();
                tok_lst->cons_set_element(j, &tok_obj_val);

                /* done with this slot */
                continue;
            }
            
            /* 
             *   The constructor arguments are the target property ID, the
             *   token type code, and extra information that depends on the
             *   type code.  We have to push the arguments backwards per the
             *   normal protocol, so start with the variant part.  
             */
            switch (tokp->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* the extra information is the sub-production object */
                G_stk->push()->set_obj(tokp->typinfo.prod_obj);
                break;

            case VMGRAM_MATCH_SPEECH:
                /* the extra info is the part-of-speech property */
                G_stk->push()->set_propid(tokp->typinfo.speech_prop);
                break;

            case VMGRAM_MATCH_NSPEECH:
                /* the extra info is a list of part-of-speech properties */
                {
                    vm_obj_id_t pos_lst_id;
                    CVmObjList *pos_lst;
                    vm_prop_id_t *pp;
                    size_t k;

                    /* create the property list */
                    pos_lst_id = CVmObjList::create(
                        vmg_ FALSE, tokp->typinfo.nspeech.cnt);
                    pos_lst = (CVmObjList *)vm_objp(vmg_ pos_lst_id);

                    /* push it */
                    G_stk->push()->set_obj(pos_lst_id);

                    /* populate it */
                    for (k = 0, pp = tokp->typinfo.nspeech.props ;
                         k < tokp->typinfo.nspeech.cnt ;
                         ++k, ++pp)
                    {
                        vm_val_t val;
                        
                        /* fill in this element */
                        val.set_propid(*pp);
                        pos_lst->cons_set_element(k, &val);
                    }
                }
                break;

            case VMGRAM_MATCH_LITERAL:
                /* the extra info is the literal string value */
                G_stk->push()->set_obj(CVmObjString::create(
                    vmg_ FALSE, tokp->typinfo.lit.str,
                    tokp->typinfo.lit.len));
                break;

            case VMGRAM_MATCH_TOKTYPE:
                /* the extra information is the token class enum */
                G_stk->push()->set_enum(tokp->typinfo.toktyp_enum);
                break;

            case VMGRAM_MATCH_STAR:
                /* 
                 *   for a 'star' type, there is no extra information, but
                 *   push nil to keep the argument list uniform 
                 */
                G_stk->push()->set_nil();
                break;

            default:
                assert(FALSE);
                break;
            }

            /* now push the target property and type code */
            G_stk->push()->set_int(tokp->typ);
            if (tokp->prop != VM_INVALID_PROP)
                G_stk->push()->set_propid(tokp->prop);
            else
                G_stk->push()->set_nil();

            /* 
             *   the first argument to the constructor is the base class,
             *   which is the imported GrammarAltTokInfo class object 
             */
            G_stk->push()->set_obj(G_predef->gramprod_gram_alt_tok_info);

            /* create the object, at long last */
            tok_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 4));

            /* add it to our token list */
            tok_lst->cons_set_element(j, &tok_obj_val);
        }

        /* 
         *   Create the GrammarAltInfo object to desribe the alternative.
         *   Pass in the score, badness, match object, and token list as
         *   arguments to the constructor, which we'll count on to stash the
         *   information away in the new object.
         *   
         *   Note that the first constructor argument is the superclass,
         *   which is the imported GrammarAltInfo class object.  
         */
        G_stk->push()->set_obj(tok_lst_id);
        G_stk->push()->set_obj((*altp)->proc_obj);
        G_stk->push()->set_int((*altp)->badness);
        G_stk->push()->set_int((*altp)->score);
        G_stk->push()->set_obj(G_predef->gramprod_gram_alt_info);
        alt_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 5));

        /* add the new GrammarAltInfo to the main alternative list */
        alt_lst->cons_set_element(i, &alt_obj_val);

        /* 
         *   It's safe to discard the gc protection for the token list now,
         *   since a reference to is now stashed away in the GrammarAltInfo
         *   object, which in turn is referenced from our main alternative
         *   list, which we stashed on the stack earlier for gc protection.  
         */
        G_stk->discard();
    }

    /* it's safe to discard our gc protection for the main list now */
    G_stk->discard();

    /* return the main list */
    retval->set_obj(alt_lst_id);

    /* successful evaluation */
    return TRUE;
}